

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

int tjEncodeYUV(tjhandle handle,uchar *srcBuf,int width,int pitch,int height,int pixelSize,
               uchar *dstBuf,int subsamp,int flags)

{
  int iVar1;
  undefined4 in_ECX;
  int in_EDX;
  uchar *in_RSI;
  int in_EDI;
  undefined4 in_R8D;
  int in_R9D;
  int unaff_retaddr;
  int in_stack_00000018;
  int in_stack_ffffffffffffffd0;
  undefined4 uVar2;
  uchar *dstBuf_00;
  
  uVar2 = in_R8D;
  dstBuf_00 = in_RSI;
  getPixelFormat(in_R9D,in_stack_00000018);
  iVar1 = tjEncodeYUV2((tjhandle)CONCAT44(uVar2,in_R9D),(uchar *)CONCAT44(in_R8D,in_ECX),in_EDX,
                       in_stack_ffffffffffffffd0,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,dstBuf_00,
                       in_EDI,unaff_retaddr);
  return iVar1;
}

Assistant:

DLLEXPORT int tjEncodeYUV(tjhandle handle, unsigned char *srcBuf, int width,
                          int pitch, int height, int pixelSize,
                          unsigned char *dstBuf, int subsamp, int flags)
{
  return tjEncodeYUV2(handle, srcBuf, width, pitch, height,
                      getPixelFormat(pixelSize, flags), dstBuf, subsamp,
                      flags);
}